

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_int32 *
ma_dr_wav_open_memory_and_read_pcm_frames_s32
          (void *data,size_t dataSize,uint *channelsOut,uint *sampleRateOut,
          ma_uint64 *totalFrameCountOut,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_bool32 mVar1;
  ma_int32 *pmVar2;
  ma_dr_wav wav;
  ma_dr_wav local_1b0;
  
  if (channelsOut != (uint *)0x0) {
    *channelsOut = 0;
  }
  if (sampleRateOut != (uint *)0x0) {
    *sampleRateOut = 0;
  }
  if (totalFrameCountOut != (ma_uint64 *)0x0) {
    *totalFrameCountOut = 0;
  }
  pmVar2 = (ma_int32 *)0x0;
  mVar1 = ma_dr_wav_init_memory_ex
                    (&local_1b0,data,dataSize,(ma_dr_wav_chunk_proc)0x0,(void *)0x0,0,
                     pAllocationCallbacks);
  if (mVar1 != 0) {
    pmVar2 = ma_dr_wav__read_pcm_frames_and_close_s32
                       (&local_1b0,channelsOut,sampleRateOut,totalFrameCountOut);
  }
  return pmVar2;
}

Assistant:

MA_API ma_int32* ma_dr_wav_open_memory_and_read_pcm_frames_s32(const void* data, size_t dataSize, unsigned int* channelsOut, unsigned int* sampleRateOut, ma_uint64* totalFrameCountOut, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_wav wav;
    if (channelsOut) {
        *channelsOut = 0;
    }
    if (sampleRateOut) {
        *sampleRateOut = 0;
    }
    if (totalFrameCountOut) {
        *totalFrameCountOut = 0;
    }
    if (!ma_dr_wav_init_memory(&wav, data, dataSize, pAllocationCallbacks)) {
        return NULL;
    }
    return ma_dr_wav__read_pcm_frames_and_close_s32(&wav, channelsOut, sampleRateOut, totalFrameCountOut);
}